

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwaLookups.cpp
# Opt level: O0

void generateNoop(void)

{
  unsigned_short src;
  char *tmp;
  unsigned_short dst;
  int i;
  ushort local_6;
  int local_4;
  
  printf("const unsigned short dwaCompressorNoOp[] = \n");
  printf("{");
  for (local_4 = 0; local_4 < 0x10000; local_4 = local_4 + 1) {
    if (local_4 % 8 == 0) {
      printf("\n    ");
    }
    Imf::Xdr::write<Imf::CharPtrIO,char*>((char **)&local_6,(unsigned_short)local_4);
    printf("0x%04x, ",(ulong)local_6);
  }
  printf("\n};\n");
  return;
}

Assistant:

void
generateNoop()
{
    printf("const unsigned short dwaCompressorNoOp[] = \n");
    printf("{");
    for (int i=0; i<65536; ++i) {

        if (i % 8 == 0) {
            printf("\n    ");
        }

        unsigned short dst;
        char *tmp = (char *)(&dst);

        unsigned short src = (unsigned short)i;
        Xdr::write <CharPtrIO> (tmp,  src);

        printf("0x%04x, ", dst);
    }
    printf("\n};\n");
}